

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# belief.cpp
# Opt level: O0

ostream * despot::operator<<(ostream *os,Belief *belief)

{
  string local_38 [32];
  Belief *local_18;
  Belief *belief_local;
  ostream *os_local;
  
  local_18 = belief;
  belief_local = (Belief *)os;
  (*belief->_vptr_Belief[4])();
  std::operator<<(os,local_38);
  std::__cxx11::string::~string(local_38);
  return (ostream *)belief_local;
}

Assistant:

ostream& operator<<(ostream& os, const Belief& belief) {
	os << (&belief)->text();
	return os;
}